

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_platform.cpp
# Opt level: O0

void lzham_debug_break(void)

{
  return;
}

Assistant:

void lzham_debug_break(void)
{
#if LZHAM_USE_WIN32_API
   DebugBreak();
#elif (TARGET_OS_MAC == 1) && (TARGET_IPHONE_SIMULATOR == 0) && (TARGET_OS_IPHONE == 0)
//   __asm {int 3}
//   __asm("int $3")
   assert(0);   
#else
   assert(0);
#endif
}